

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

bool __thiscall ON_HatchLine::Write(ON_HatchLine *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  int iVar2;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *archive_local;
  ON_HatchLine *this_local;
  
  iVar2 = ON_BinaryArchive::Archive3dmVersion(archive);
  if (iVar2 < 0x3c) {
    this_local._7_1_ = WriteV5(this,archive);
  }
  else {
    bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
    if (bVar1) {
      this_local._7_1_ = false;
      bVar1 = ON_BinaryArchive::WriteDouble(archive,this->m_angle_radians);
      if ((((bVar1) && (bVar1 = ON_BinaryArchive::WritePoint(archive,&this->m_base), bVar1)) &&
          (bVar1 = ON_BinaryArchive::WriteVector(archive,&this->m_offset), bVar1)) &&
         (bVar1 = ON_BinaryArchive::WriteArray(archive,&this->m_dashes), bVar1)) {
        this_local._7_1_ = true;
      }
      bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
      if (!bVar1) {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_HatchLine::Write(ON_BinaryArchive& archive) const
{
  if (archive.Archive3dmVersion() < 60)
    return WriteV5(archive);

  const int major_version = 1;
  const int minor_version = 0;
  if (!archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK, major_version, minor_version))
    return false;
  bool rc = false;
  for (;;)
  {
    if (!archive.WriteDouble(m_angle_radians))
      break;
    if (!archive.WritePoint(m_base))
      break;
    if (!archive.WriteVector(m_offset))
      break;
    if (!archive.WriteArray(m_dashes))
      break;
    rc = true;
    break;
  }
  if (!archive.EndWrite3dmChunk())
    rc = false;

  return rc;
}